

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O0

bool __thiscall
ON_Viewport::GetFrustumBottomPlaneEquation
          (ON_Viewport *this,ON_PlaneEquation *bottom_plane_equation)

{
  ON_3dPoint P;
  ON_3dPoint P_00;
  ON_3dVector N;
  bool bVar1;
  byte local_d9;
  ON_3dVector local_c0;
  ON_3dPoint local_a8;
  ON_3dVector local_90;
  ON_3dVector local_78;
  ON_3dVector local_60;
  double local_48;
  double local_40;
  double local_38;
  undefined1 local_30 [8];
  ON_2dVector v;
  bool rc;
  ON_PlaneEquation *bottom_plane_equation_local;
  ON_Viewport *this_local;
  
  local_d9 = 0;
  if ((this->m_bValidCamera & 1U) != 0) {
    local_d9 = this->m_bValidFrustum;
  }
  v.y._7_1_ = local_d9 & 1;
  if ((bool)v.y._7_1_ != false) {
    bVar1 = IsPerspectiveProjection(this);
    if (bVar1) {
      ON_2dVector::ON_2dVector((ON_2dVector *)local_30,this->m_frus_near,this->m_frus_bottom);
      v.y._7_1_ = ON_2dVector::Unitize((ON_2dVector *)local_30);
      if ((bool)v.y._7_1_) {
        local_48 = (this->m_CamLoc).x;
        local_40 = (this->m_CamLoc).y;
        local_38 = (this->m_CamLoc).z;
        ::operator*(&local_78,(double)local_30,&this->m_CamY);
        ::operator*(&local_90,v.x,&this->m_CamZ);
        ON_3dVector::operator+(&local_60,&local_78,&local_90);
        P.y = local_40;
        P.x = local_48;
        P.z = local_38;
        N.y = local_60.y;
        N.x = local_60.x;
        N.z = local_60.z;
        v.y._7_1_ = ON_PlaneEquation::Create(bottom_plane_equation,P,N);
      }
    }
    else {
      ::operator*(&local_c0,this->m_frus_bottom,&this->m_CamY);
      ON_3dPoint::operator+(&local_a8,&this->m_CamLoc,&local_c0);
      P_00.y = local_a8.y;
      P_00.x = local_a8.x;
      P_00.z = local_a8.z;
      v.y._7_1_ = ON_PlaneEquation::Create(bottom_plane_equation,P_00,this->m_CamY);
    }
  }
  return (bool)v.y._7_1_;
}

Assistant:

bool ON_Viewport::GetFrustumBottomPlaneEquation( 
  ON_PlaneEquation& bottom_plane_equation
  ) const
{
  bool rc = m_bValidCamera && m_bValidFrustum;
  if (rc)
  {

    if ( IsPerspectiveProjection() )
    {
      ON_2dVector v(m_frus_near,m_frus_bottom);
      if ( 0 != (rc = v.Unitize()) )
      {
        rc = bottom_plane_equation.Create(m_CamLoc, v.x*m_CamY + v.y*m_CamZ);
      }
    }
    else
    {
      rc = bottom_plane_equation.Create(m_CamLoc + m_frus_bottom*m_CamY, m_CamY);
    }
  }
  return rc;
}